

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_counting.cpp
# Opt level: O3

int main(void)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int i;
  long lVar5;
  int arr [12551];
  undefined8 uStack_340;
  int local_338 [200];
  
  iVar4 = 0;
  do {
    lVar5 = 0;
    do {
      uStack_340 = (code *)0x1022ac;
      iVar3 = rand();
      local_338[lVar5] = iVar3 % 10;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 200);
    uStack_340 = (code *)0x1022e6;
    counting_sort<int>(local_338,200);
    lVar5 = 4;
    while (lVar5 != 800) {
      piVar1 = (int *)((long)local_338 + lVar5);
      lVar2 = lVar5 + -4;
      lVar5 = lVar5 + 4;
      if (*piVar1 < *(int *)((long)local_338 + lVar2)) {
        uStack_340 = counting_sort<int>;
        __assert_fail("std::is_sorted(arr, arr + n)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_counting.cpp"
                      ,0x28,"int main()");
      }
    }
    iVar4 = iVar4 + 1;
    if (iVar4 == 100) {
      uStack_340 = (code *)0x102326;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Successfully sorted using counting sort! \n",0x2a);
      return 0;
    }
  } while( true );
}

Assistant:

int main() {
    int n = 200;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        counting_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using counting sort! \n";
    return 0;
}